

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase3CS::Run(BasicAtomicCase3CS *this)

{
  CallLogWrapper *this_00;
  undefined8 *puVar1;
  uint uVar2;
  bool bVar3;
  GLuint program;
  void *pvVar4;
  uint *puVar5;
  long lVar6;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "\nlayout(local_size_y = 4) in;\nlayout(std430) coherent buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_fs_buffer;\nvoid main() {\n  atomicAdd(g_fs_buffer.u[0].x, g_fs_buffer.u[gl_LocalInvocationID.y][2]);\n  atomicAdd(g_fs_buffer.i[0].x, 2 * g_fs_buffer.i[gl_LocalInvocationID.y][1]);\n  atomicAdd(g_fs_buffer.u[0].x, g_fs_buffer.u[gl_LocalInvocationID.y].z);\n  atomicAdd(g_fs_buffer.i[0].x, 2 * g_fs_buffer.i[gl_LocalInvocationID.y].y);\n}"
             ,"");
  program = ShaderStorageBufferObjectBase::CreateProgramCS
                      (&this->super_ShaderStorageBufferObjectBase,&local_38);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (bVar3) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x80,(void *)0x0,0x88e8);
    pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x80,2);
    if (pvVar4 != (void *)0x0) {
      lVar6 = 0;
      do {
        *(undefined8 *)((long)pvVar4 + lVar6) = 0x100000000;
        ((undefined8 *)((long)pvVar4 + lVar6))[1] = 2;
        puVar1 = (undefined8 *)((long)pvVar4 + lVar6 + 0x10);
        *puVar1 = 0x100000000;
        puVar1[1] = 2;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x80);
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      puVar5 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,4,1);
      if (puVar5 != (uint *)0x0) {
        uVar2 = *puVar5;
        if (uVar2 == 0x10) {
          glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
          puVar5 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0x40,4,1);
          if (puVar5 == (uint *)0x0) {
            return -1;
          }
          uVar2 = *puVar5;
          if (uVar2 == 0x10) {
            glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
            return 0;
          }
        }
        anon_unknown_0::Output("Data at offset 0 is %d should be %d.\n",(ulong)uVar2,0x10);
      }
    }
  }
  return -1;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_y = 4) in;" NL "layout(std430) coherent buffer Buffer {" NL "  uvec4 u[4];" NL
			   "  ivec3 i[4];" NL "} g_fs_buffer;" NL "void main() {" NL
			   "  atomicAdd(g_fs_buffer.u[0].x, g_fs_buffer.u[gl_LocalInvocationID.y][2]);" NL
			   "  atomicAdd(g_fs_buffer.i[0].x, 2 * g_fs_buffer.i[gl_LocalInvocationID.y][1]);" NL
			   "  atomicAdd(g_fs_buffer.u[0].x, g_fs_buffer.u[gl_LocalInvocationID.y].z);" NL
			   "  atomicAdd(g_fs_buffer.i[0].x, 2 * g_fs_buffer.i[gl_LocalInvocationID.y].y);" NL "}";
		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* init storage buffer */
		{
			glGenBuffers(1, &m_storage_buffer);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, 8 * sizeof(int) * 4, NULL, GL_DYNAMIC_DRAW);
			ivec4* ptr = reinterpret_cast<ivec4*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8 * sizeof(int) * 4, GL_MAP_WRITE_BIT));
			if (!ptr)
				return ERROR;
			for (int i = 0; i < 4; ++i)
			{
				ptr[i * 2]	 = ivec4(0, 1, 2, 0);
				ptr[i * 2 + 1] = ivec4(0, 1, 2, 0);
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		GLuint* u = (GLuint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4, GL_MAP_READ_BIT);
		if (!u)
			return ERROR;
		if (*u != 16)
		{
			Output("Data at offset 0 is %d should be %d.\n", *u, 16);
			return ERROR;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLint* i = (GLint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 64, 4, GL_MAP_READ_BIT);
		if (!i)
			return ERROR;
		if (*i != 16)
		{
			Output("Data at offset 0 is %d should be %d.\n", *i, 16);
			return ERROR;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		return NO_ERROR;
	}